

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valtype.h
# Opt level: O1

bool __thiscall wasm::analysis::ValType::meet(ValType *this,Element *meetee,Element meeter)

{
  Type a;
  bool bVar1;
  
  a.id = meetee->id;
  if (meeter.id == 0 || a.id == meeter.id) {
    bVar1 = false;
  }
  else {
    if (a.id == 0) {
      bVar1 = true;
    }
    else {
      meeter.id = (uintptr_t)wasm::Type::getGreatestLowerBound(a,meeter.id);
      bVar1 = meeter.id != meetee->id;
      if (!bVar1) {
        return bVar1;
      }
    }
    meetee->id = (uintptr_t)meeter;
  }
  return bVar1;
}

Assistant:

bool meet(Element& meetee, Element meeter) const noexcept {
    if (meetee == meeter || meeter == Type::none) {
      return false;
    }
    if (meetee == Type::none) {
      meetee = meeter;
      return true;
    }
    auto glb = Type::getGreatestLowerBound(meetee, meeter);
    if (glb != meetee) {
      meetee = glb;
      return true;
    }
    return false;
  }